

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O3

uchar * pull_skip(uchar **cursor,size_t *max,size_t len)

{
  uchar *puVar1;
  size_t sVar2;
  
  puVar1 = *cursor;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = *max - len;
    if (*max < len) {
      *cursor = (uchar *)0x0;
      sVar2 = 0;
      puVar1 = (uchar *)0x0;
    }
    else {
      *cursor = puVar1 + len;
    }
    *max = sVar2;
    return puVar1;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *pull_skip(const unsigned char **cursor, size_t *max,
                               size_t len)
{
    const unsigned char *p;

    if (*cursor == NULL) {
        return NULL;
    }

    if (len > *max) {
        pull_failed(cursor, max);
        return NULL;
    }

    p = *cursor;
    *cursor += len;
    *max -= len;
    return p;
}